

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O1

NJDNode * NJDNode_insert(NJDNode *prev,NJDNode *next,NJDNode *node)

{
  _NJDNode *p_Var1;
  NJDNode *extraout_RAX;
  NJDNode *pNVar2;
  
  if ((prev != (NJDNode *)0x0) && (p_Var1 = node, next != (NJDNode *)0x0)) {
    do {
      pNVar2 = p_Var1;
      p_Var1 = pNVar2->next;
    } while (pNVar2->next != (_NJDNode *)0x0);
    prev->next = node;
    node->prev = prev;
    next->prev = pNVar2;
    pNVar2->next = next;
    return pNVar2;
  }
  NJDNode_insert_cold_1();
  NJDNode_fprint(prev,_stdout);
  return extraout_RAX;
}

Assistant:

NJDNode *NJDNode_insert(NJDNode * prev, NJDNode * next, NJDNode * node)
{
   NJDNode *tail;

   if (prev == NULL || next == NULL) {
      fprintf(stderr, "ERROR: NJDNode_insert() in njd_node.c: NJDNodes are not specified.\n");
      exit(1);
   }
   for (tail = node; tail->next != NULL; tail = tail->next);
   prev->next = node;
   node->prev = prev;
   next->prev = tail;
   tail->next = next;

   return tail;
}